

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
             *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar2 = this->index_;
  if (uVar2 < 0x22) {
    uVar3 = uVar2 - 0x11;
    if (uVar2 < 0x11) {
      uVar3 = uVar2;
    }
    uVar2 = uVar3 + 0x10;
    if ((((uVar2 < 0x22) && (uVar4 = uVar3 + 0xf, uVar4 < 0x22)) &&
        (uVar7 = uVar3 + 0xb, uVar7 < 0x22)) &&
       ((uVar3 + 10 < 0x22 && (uVar1 = uVar3 + 7, uVar1 < 0x22)))) {
      uVar9 = uVar3 - 6;
      if (uVar7 < 0x11) {
        uVar9 = uVar7;
      }
      uVar7 = uVar3 - 2;
      if (uVar4 < 0x11) {
        uVar7 = uVar4;
      }
      uVar4 = uVar3 - 1;
      if (uVar2 < 0x11) {
        uVar4 = uVar2;
      }
      uVar2 = uVar3 - 10;
      if (uVar1 < 0x11) {
        uVar2 = uVar1;
      }
      uVar5 = this->state_[uVar7] & 0x7fffff | this->state_[uVar4] & 0xff800000;
      uVar6 = this->state_[uVar9] >> 6 ^
              this->state_[uVar3] << 0x15 ^ this->state_[uVar3] ^ this->state_[uVar9];
      uVar8 = this->state_[uVar2] << 0xd ^ this->state_[uVar2];
      uVar10 = uVar6 ^ uVar8;
      uVar5 = uVar10 >> 0xd ^ uVar5 ^ uVar8 << 5 ^ uVar5 >> 0xd ^ uVar6 << 10 ^ uVar10;
      this->state_[uVar3] = uVar10;
      this->state_[uVar4] = uVar5;
      this->index_ = uVar4;
      return uVar5;
    }
  }
  __assert_fail("(value < 2 * r)&&(\"value out of range\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/well.hpp",
                0xd5,
                "static UIntType boost::random::detail::generic_modulo<unsigned long, 17>::compute(UIntType) [UIntType = unsigned long, r = 17]"
               );
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }